

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_consecutive_gap.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> e1;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  vector<int,_std::allocator<int>_> local_30;
  int local_14 [3];
  
  local_14[0] = 1;
  local_14[1] = 10;
  local_14[2] = 5;
  __l._M_len = 3;
  __l._M_array = local_14;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_49);
  std::vector<int,_std::allocator<int>_>::vector(&local_48,&local_30);
  iVar1 = max_gap(&local_48);
  if (iVar1 == 5) {
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  __assert_fail("max_gap(e1) == 5",
                "/workspace/llm4binary/github/license_c_cmakelists/lukasmartinelli[P]sharpen/challenges/array/max_consecutive_gap.cpp"
                ,0x16,"int main()");
}

Assistant:

int main() {
    std::vector<int> e1 = {1, 10, 5};
    assert(max_gap(e1) == 5);
}